

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls13_set_traffic_key
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,evp_aead_direction_t direction,
          SSL_SESSION *session,Span<const_unsigned_char> traffic_secret)

{
  ushort uVar1;
  SSL_CIPHER *pSVar2;
  code *pcVar3;
  string_view label;
  string_view label_00;
  Span<const_unsigned_char> mac_key;
  Span<const_unsigned_char> hash;
  Span<const_unsigned_char> hash_00;
  Span<const_unsigned_char> fixed_iv;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> secret;
  Span<unsigned_char> out;
  Span<const_unsigned_char> secret_00;
  bool bVar4;
  byte bVar5;
  uint16_t version_00;
  int iVar6;
  EVP_MD *digest_00;
  size_t sVar7;
  undefined4 in_register_0000000c;
  SSL_SESSION *session_00;
  size_t in_R9;
  Span<const_unsigned_char> enc_key;
  Span<unsigned_char> SVar8;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_220;
  SSL_SESSION *local_218;
  undefined8 local_208;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_1f8;
  uchar *local_1f0;
  size_t sStack_1e8;
  Span<const_unsigned_char> local_1e0;
  size_t local_1d0 [2];
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_1c0;
  Span<const_unsigned_char> local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  SSL_SESSION *local_198;
  size_t sStack_190;
  uchar *local_188;
  uchar *puStack_180;
  Span<const_unsigned_char> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  SSL_SESSION *local_158;
  size_t sStack_150;
  uchar *local_148;
  uchar *puStack_140;
  Span<unsigned_char> local_138;
  undefined1 auStack_128 [8];
  Span<unsigned_char> iv;
  undefined1 auStack_108 [8];
  Span<unsigned_char> key;
  uint8_t iv_buf [32];
  uint8_t key_buf [80];
  size_t local_80;
  size_t discard;
  EVP_AEAD *aead;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_58;
  UniquePtr<SSLAEADContext> traffic_aead;
  bool is_dtls;
  EVP_MD *digest;
  uint16_t version;
  SSL_SESSION *session_local;
  evp_aead_direction_t direction_local;
  ssl_encryption_level_t level_local;
  SSL *ssl_local;
  Span<const_unsigned_char> traffic_secret_local;
  
  session_00 = (SSL_SESSION *)CONCAT44(in_register_0000000c,direction);
  version_00 = ssl_session_protocol_version(session_00);
  digest_00 = ssl_session_get_digest(session_00);
  iVar6 = SSL_is_dtls((SSL *)this);
  traffic_aead._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._7_1_ = iVar6 != 0;
  std::unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bssl::SSLAEADContext,bssl::internal::Deleter> *)&local_58);
  iVar6 = SSL_is_quic((SSL *)this);
  if (iVar6 == 0) {
    bVar4 = ssl_cipher_get_evp_aead
                      ((EVP_AEAD **)&discard,&local_80,&local_80,session_00->cipher,version_00);
    if (!bVar4) {
      traffic_secret_local.size_._7_1_ = false;
      goto LAB_001cea68;
    }
    Span<unsigned_char>::Span<80ul>
              ((Span<unsigned_char> *)&iv.size_,(uchar (*) [80])(iv_buf + 0x18));
    sVar7 = EVP_AEAD_key_length((EVP_AEAD *)discard);
    SVar8 = Span<unsigned_char>::first((Span<unsigned_char> *)&iv.size_,sVar7);
    key.data_ = (uchar *)SVar8.size_;
    auStack_108 = (undefined1  [8])SVar8.data_;
    Span<unsigned_char>::Span<32ul>(&local_138,(uchar (*) [32])&key.size_);
    sVar7 = EVP_AEAD_nonce_length((EVP_AEAD *)discard);
    SVar8 = Span<unsigned_char>::first(&local_138,sVar7);
    iv.data_ = (uchar *)SVar8.size_;
    auStack_128 = (undefined1  [8])SVar8.data_;
    local_148 = (uchar *)auStack_108;
    puStack_140 = key.data_;
    local_158 = session;
    sStack_150 = in_R9;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_168,"key");
    Span<const_unsigned_char>::Span(&local_178);
    SVar8.size_ = (size_t)puStack_140;
    SVar8.data_ = local_148;
    secret_00.size_ = sStack_150;
    secret_00.data_ = (uchar *)local_158;
    label._M_str = local_168._M_str;
    label._M_len = local_168._M_len;
    hash.size_ = local_178.size_;
    hash.data_ = local_178.data_;
    bVar4 = hkdf_expand_label(SVar8,digest_00,secret_00,label,hash,
                              (bool)(traffic_aead._M_t.
                                     super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>.
                                     _M_head_impl._7_1_ & 1));
    if (bVar4) {
      local_188 = (uchar *)auStack_128;
      puStack_180 = iv.data_;
      local_198 = session;
      sStack_190 = in_R9;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"iv");
      Span<const_unsigned_char>::Span(&local_1b8);
      out.size_ = (size_t)puStack_180;
      out.data_ = local_188;
      secret.size_ = sStack_190;
      secret.data_ = (uchar *)local_198;
      label_00._M_str = local_1a8._M_str;
      label_00._M_len = local_1a8._M_len;
      hash_00.size_ = local_1b8.size_;
      hash_00.data_ = local_1b8.data_;
      bVar4 = hkdf_expand_label(out,digest_00,secret,label_00,hash_00,
                                (bool)(traffic_aead._M_t.
                                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>.
                                       _M_head_impl._7_1_ & 1));
      if (bVar4) {
        uVar1 = session_00->ssl_version;
        pSVar2 = session_00->cipher;
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)local_1d0,(Span<unsigned_char> *)auStack_108);
        Span<const_unsigned_char>::Span(&local_1e0);
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_1f0,(Span<unsigned_char> *)auStack_128);
        mac_key.size_ = local_1e0.size_;
        mac_key.data_ = local_1e0.data_;
        fixed_iv.size_ = sStack_1e8;
        fixed_iv.data_ = local_1f0;
        enc_key.size_ = local_1d0[0];
        enc_key.data_ = (uchar *)pSVar2;
        SSLAEADContext::Create
                  ((evp_aead_direction_t)&local_1c0,(uint16_t)level,(SSL_CIPHER *)(ulong)uVar1,
                   enc_key,mac_key,fixed_iv);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
                  (&local_58,&local_1c0);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_1c0);
        goto LAB_001ce83d;
      }
    }
    traffic_secret_local.size_._7_1_ = false;
  }
  else {
    SSLAEADContext::CreatePlaceholderForQUIC((SSLAEADContext *)&aead,session_00->cipher);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
              (&local_58,(unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&aead);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&aead);
LAB_001ce83d:
    bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
    if (bVar4) {
      traffic_secret_local.data_._0_4_ = (undefined4)in_R9;
      traffic_secret_local.data_._4_4_ = (undefined4)(in_R9 >> 0x20);
      if (level == ssl_encryption_initial) {
        pcVar3 = *(code **)(*(long *)this + 0x98);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::unique_ptr
                  (&local_1f8,&local_58);
        uStack_200 = traffic_secret_local.data_._0_4_;
        uStack_1fc = traffic_secret_local.data_._4_4_;
        local_208 = session;
        bVar5 = (*pcVar3)(this,(ulong)ssl & 0xffffffff,&local_1f8,session,in_R9);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_1f8);
        if (((bVar5 ^ 0xff) & 1) != 0) {
          traffic_secret_local.size_._7_1_ = false;
          goto LAB_001cea68;
        }
        in_00.size_ = in_R9;
        in_00.data_ = (uchar *)session;
        local_218 = session;
        InplaceVector<unsigned_char,_64UL>::CopyFrom
                  ((InplaceVector<unsigned_char,_64UL> *)(*(long *)(this + 0x30) + 0x161),in_00);
      }
      else {
        pcVar3 = *(code **)(*(long *)this + 0xa0);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::unique_ptr
                  (&local_220,&local_58);
        bVar5 = (*pcVar3)(this,(ulong)ssl & 0xffffffff,&local_220,session,in_R9);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_220);
        if (((bVar5 ^ 0xff) & 1) != 0) {
          traffic_secret_local.size_._7_1_ = false;
          goto LAB_001cea68;
        }
        in.size_ = in_R9;
        in.data_ = (uchar *)session;
        InplaceVector<unsigned_char,_64UL>::CopyFrom
                  ((InplaceVector<unsigned_char,_64UL> *)(*(long *)(this + 0x30) + 0x120),in);
      }
      traffic_secret_local.size_._7_1_ = true;
    }
    else {
      traffic_secret_local.size_._7_1_ = false;
    }
  }
LAB_001cea68:
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  return traffic_secret_local.size_._7_1_;
}

Assistant:

bool tls13_set_traffic_key(SSL *ssl, enum ssl_encryption_level_t level,
                           enum evp_aead_direction_t direction,
                           const SSL_SESSION *session,
                           Span<const uint8_t> traffic_secret) {
  uint16_t version = ssl_session_protocol_version(session);
  const EVP_MD *digest = ssl_session_get_digest(session);
  bool is_dtls = SSL_is_dtls(ssl);
  UniquePtr<SSLAEADContext> traffic_aead;
  if (SSL_is_quic(ssl)) {
    // Install a placeholder SSLAEADContext so that SSL accessors work. The
    // encryption itself will be handled by the SSL_QUIC_METHOD.
    traffic_aead = SSLAEADContext::CreatePlaceholderForQUIC(session->cipher);
  } else {
    // Look up cipher suite properties.
    const EVP_AEAD *aead;
    size_t discard;
    if (!ssl_cipher_get_evp_aead(&aead, &discard, &discard, session->cipher,
                                 version)) {
      return false;
    }

    // Derive the key and IV.
    uint8_t key_buf[EVP_AEAD_MAX_KEY_LENGTH], iv_buf[EVP_AEAD_MAX_NONCE_LENGTH];
    auto key = Span(key_buf).first(EVP_AEAD_key_length(aead));
    auto iv = Span(iv_buf).first(EVP_AEAD_nonce_length(aead));
    if (!hkdf_expand_label(key, digest, traffic_secret, "key", {}, is_dtls) ||
        !hkdf_expand_label(iv, digest, traffic_secret, "iv", {}, is_dtls)) {
      return false;
    }

    traffic_aead = SSLAEADContext::Create(direction, session->ssl_version,
                                          session->cipher, key, {}, iv);
  }

  if (!traffic_aead) {
    return false;
  }

  if (direction == evp_aead_open) {
    if (!ssl->method->set_read_state(ssl, level, std::move(traffic_aead),
                                     traffic_secret)) {
      return false;
    }
    ssl->s3->read_traffic_secret.CopyFrom(traffic_secret);
  } else {
    if (!ssl->method->set_write_state(ssl, level, std::move(traffic_aead),
                                      traffic_secret)) {
      return false;
    }
    ssl->s3->write_traffic_secret.CopyFrom(traffic_secret);
  }

  return true;
}